

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

bool jbcoin::STObject::equivalentSTObject(STObject *obj1,STObject *obj2)

{
  STBase *pSVar1;
  STBase *pSVar2;
  int iVar3;
  int iVar4;
  pointer ppSVar5;
  bool bVar6;
  pointer ppSVar7;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf2;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf1;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_60;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> local_48;
  
  getSortedFields(&local_48,obj1);
  getSortedFields(&local_60,obj2);
  if ((long)local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_60.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    ppSVar5 = local_60.
              super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = local_48.
              super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar6 = true;
    }
    else {
      do {
        pSVar1 = *ppSVar7;
        pSVar2 = *ppSVar5;
        iVar3 = (*pSVar1->_vptr_STBase[4])(pSVar1);
        iVar4 = (*pSVar2->_vptr_STBase[4])(pSVar2);
        if ((iVar3 != iVar4) ||
           (iVar3 = (*pSVar1->_vptr_STBase[9])(pSVar1,pSVar2), (char)iVar3 == '\0')) {
          bVar6 = false;
          goto LAB_001b413d;
        }
        ppSVar7 = ppSVar7 + 1;
        ppSVar5 = ppSVar5 + 1;
      } while (ppSVar7 !=
               local_48.
               super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      bVar6 = true;
    }
  }
  else {
    bVar6 = false;
  }
LAB_001b413d:
  if (local_60.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool STObject::equivalentSTObject (STObject const& obj1, STObject const& obj2)
{
    auto sf1 = getSortedFields (obj1);
    auto sf2 = getSortedFields (obj2);

    return std::equal (sf1.begin (), sf1.end (), sf2.begin (), sf2.end (),
        [] (STBase const* st1, STBase const* st2)
        {
            return (st1->getSType() == st2->getSType()) &&
                st1->isEquivalent (*st2);
        });
}